

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void mp::ReadNLString<ExprCounter>(NLStringRef str,ExprCounter *handler,CStringRef name,int flags)

{
  NLStringRef data;
  Kind k;
  undefined8 uVar1;
  undefined8 in_RCX;
  ExprCounter *in_RDX;
  int in_R8D;
  Kind arith_kind;
  NLHeader header;
  TextReader<fmt::Locale> reader;
  RefType adapter;
  undefined6 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf6;
  undefined1 in_stack_fffffffffffffdf7;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  NLHandler<mp::NullNLHandler<Expr>,_Expr> *this;
  BasicCStringRef<char> local_1f8;
  undefined8 local_1f0;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  CStringRef in_stack_fffffffffffffe20;
  NLHeader *in_stack_fffffffffffffe28;
  TextReader<fmt::Locale> *in_stack_fffffffffffffe30;
  NLHandler<mp::NullNLHandler<Expr>,_Expr> local_1b0;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  ReadError *in_stack_fffffffffffffe60;
  CStringRef in_stack_fffffffffffffe68;
  CStringRef in_stack_fffffffffffffe70;
  NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *in_stack_fffffffffffffe80;
  int local_108;
  Kind local_a8;
  TextReader<fmt::Locale> local_88;
  ExprCounter *local_30;
  int local_24;
  undefined8 local_18;
  
  data.size_ = (size_t)in_stack_fffffffffffffe30;
  data.data_ = (char *)in_stack_fffffffffffffe28;
  local_30 = in_RDX;
  local_24 = in_R8D;
  local_18 = in_RCX;
  internal::TextReader<fmt::Locale>::TextReader
            ((TextReader<fmt::Locale> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),data,
             in_stack_fffffffffffffe20);
  this = &local_1b0;
  memset(this,0,0x110);
  NLHeader::NLHeader((NLHeader *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)));
  internal::TextReader<fmt::Locale>::ReadHeader(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)
  ;
  NLHandler<mp::NullNLHandler<Expr>,_Expr>::OnHeader
            (this,(NLHeader *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if (local_108 == 0) {
    internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::NLReader
              ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *)
               &stack0xfffffffffffffe20,&local_88,(NLHeader *)&local_1b0,local_30,local_24);
    internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::Read
              (in_stack_fffffffffffffe80);
  }
  else if (local_108 == 1) {
    k = arith::GetKind();
    if (k == local_a8) {
      internal::ReadBinary<mp::internal::IdentityConverter,ExprCounter>
                ((TextReader<fmt::Locale> *)in_stack_fffffffffffffe70.data_,
                 (NLHeader *)in_stack_fffffffffffffe68.data_,
                 (ExprCounter *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    }
    else {
      in_stack_fffffffffffffdf7 = arith::IsIEEE(k);
      if ((!(bool)in_stack_fffffffffffffdf7) ||
         (in_stack_fffffffffffffdf6 = arith::IsIEEE(local_a8), !(bool)in_stack_fffffffffffffdf6)) {
        uVar1 = __cxa_allocate_exception(0x40);
        local_1f0 = local_18;
        fmt::BasicCStringRef<char>::BasicCStringRef
                  (&local_1f8,"unsupported floating-point arithmetic");
        ReadError::ReadError<>
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe70,in_stack_fffffffffffffe5c,
                   in_stack_fffffffffffffe58,in_stack_fffffffffffffe68);
        __cxa_throw(uVar1,&ReadError::typeinfo,ReadError::~ReadError);
      }
      internal::ReadBinary<mp::internal::EndiannessConverter,ExprCounter>
                ((TextReader<fmt::Locale> *)in_stack_fffffffffffffe70.data_,
                 (NLHeader *)in_stack_fffffffffffffe68.data_,
                 (ExprCounter *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    }
  }
  internal::TextReader<fmt::Locale>::~TextReader
            ((TextReader<fmt::Locale> *)
             CONCAT17(in_stack_fffffffffffffdf7,
                      CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)));
  return;
}

Assistant:

void ReadNLString(NLStringRef str, Handler &handler,
                  fmt::CStringRef name, int flags) {
  // If handler is a Problem-like object (Problem::Builder type is defined)
  // then use ProblemBuilder API to populate it.
  typedef internal::NLAdapter<
      Handler, internal::HasBuilder<Handler>::value> Adapter;
  typename Adapter::RefType adapter(handler);
  internal::TextReader<> reader(str, name);
  NLHeader header = NLHeader();
  reader.ReadHeader(header);
  adapter.OnHeader(header);
  switch (header.format) {
  case NLHeader::TEXT:
    internal::NLReader<internal::TextReader<>, typename Adapter::Type>(
          reader, header, adapter, flags).Read();
    break;
  case NLHeader::BINARY: {
      using internal::ReadBinary;
    arith::Kind arith_kind = arith::GetKind();
    if (arith_kind == header.arith_kind) {
      ReadBinary<internal::IdentityConverter>(reader, header, adapter, flags);
      break;
    }
    if (!IsIEEE(arith_kind)
        || !IsIEEE((arith::Kind)header.arith_kind))
      throw ReadError(name, 0, 0, "unsupported floating-point arithmetic");
    ReadBinary<internal::EndiannessConverter>(reader, header, adapter, flags);
    break;
  }
  }
}